

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O2

uint __thiscall glsl_type::std140_base_alignment(glsl_type *this,bool row_major)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  glsl_type *pgVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  uint base_alignment;
  long lVar9;
  
  do {
LAB_00186229:
    bVar2 = is_64bit(this);
    if ((this->vector_elements == '\x01') && ((*(uint *)&this->field_0x4 & 0xfe) < 0xe)) {
LAB_00186344:
      return (uint)bVar2 * 4 + 4;
    }
    bVar3 = is_vector(this);
    if (bVar3) {
      bVar6 = this->vector_elements;
      if (bVar6 - 3 < 2) {
        return (uint)bVar2 * 0x10 + 0x10;
      }
      if (bVar6 == 1) goto LAB_00186344;
      if (bVar6 == 2) {
        return (uint)bVar2 * 8 + 8;
      }
    }
    bVar6 = this->field_0x4;
    if (bVar6 == 0x11) {
      pgVar5 = (this->fields).array;
      if ((pgVar5->vector_elements == '\x01') && ((*(uint *)&pgVar5->field_0x4 & 0xfe) < 0xe)) {
LAB_001862c3:
        uVar4 = std140_base_alignment(pgVar5,(bool)(row_major & 1));
        if (uVar4 < 0x11) {
          return 0x10;
        }
        this = (this->fields).array;
      }
      else {
        bVar2 = is_vector(pgVar5);
        pgVar5 = (this->fields).array;
        if ((bVar2) ||
           (uVar4 = *(uint *)&pgVar5->field_0x4 & 0xff, uVar4 - 2 < 3 && 1 < pgVar5->matrix_columns)
           ) goto LAB_001862c3;
        this = pgVar5;
        if ((uVar4 != 0xf) && (uVar4 != 0x11)) {
          __assert_fail("this->fields.array->is_struct() || this->fields.array->is_array()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                        ,0x6ce,"unsigned int glsl_type::std140_base_alignment(bool) const");
        }
      }
      goto LAB_00186229;
    }
    bVar1 = this->matrix_columns;
    if ((bVar1 < 2) || (2 < bVar6 - 2)) {
      if (bVar6 == 0xf) {
        uVar4 = 0x10;
        lVar9 = 0x20;
        for (uVar8 = 0; uVar8 < this->length; uVar8 = uVar8 + 1) {
          uVar7 = *(uint *)((long)&((this->fields).array)->gl_type + lVar9) >> 5 & 3;
          if (uVar7 == 2) {
            bVar6 = 1;
          }
          else {
            bVar6 = row_major;
            if (uVar7 == 1) {
              bVar6 = 0;
            }
          }
          pgVar5 = *(glsl_type **)((long)(this->fields).array + lVar9 + -0x20);
          uVar7 = std140_base_alignment(pgVar5,(bool)(bVar6 & 1));
          if (uVar4 <= uVar7) {
            uVar4 = std140_base_alignment(pgVar5,(bool)(bVar6 & 1));
          }
          lVar9 = lVar9 + 0x30;
        }
        return uVar4;
      }
      __assert_fail("!\"not reached\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl_types.cpp"
                    ,0x70b,"unsigned int glsl_type::std140_base_alignment(bool) const");
    }
    uVar7 = (uint)bVar1;
    uVar4 = (uint)this->vector_elements;
    if ((row_major & 1U) != 0) {
      uVar7 = (uint)this->vector_elements;
      uVar4 = (uint)bVar1;
    }
    row_major = false;
    pgVar5 = get_instance((uint)bVar6,uVar4,1,0,false);
    this = get_array_instance(pgVar5,uVar7,0);
  } while( true );
}

Assistant:

unsigned
glsl_type::std140_base_alignment(bool row_major) const
{
   unsigned N = is_64bit() ? 8 : 4;

   /* (1) If the member is a scalar consuming <N> basic machine units, the
    *     base alignment is <N>.
    *
    * (2) If the member is a two- or four-component vector with components
    *     consuming <N> basic machine units, the base alignment is 2<N> or
    *     4<N>, respectively.
    *
    * (3) If the member is a three-component vector with components consuming
    *     <N> basic machine units, the base alignment is 4<N>.
    */
   if (this->is_scalar() || this->is_vector()) {
      switch (this->vector_elements) {
      case 1:
         return N;
      case 2:
         return 2 * N;
      case 3:
      case 4:
         return 4 * N;
      }
   }

   /* (4) If the member is an array of scalars or vectors, the base alignment
    *     and array stride are set to match the base alignment of a single
    *     array element, according to rules (1), (2), and (3), and rounded up
    *     to the base alignment of a vec4. The array may have padding at the
    *     end; the base offset of the member following the array is rounded up
    *     to the next multiple of the base alignment.
    *
    * (6) If the member is an array of <S> column-major matrices with <C>
    *     columns and <R> rows, the matrix is stored identically to a row of
    *     <S>*<C> column vectors with <R> components each, according to rule
    *     (4).
    *
    * (8) If the member is an array of <S> row-major matrices with <C> columns
    *     and <R> rows, the matrix is stored identically to a row of <S>*<R>
    *     row vectors with <C> components each, according to rule (4).
    *
    * (10) If the member is an array of <S> structures, the <S> elements of
    *      the array are laid out in order, according to rule (9).
    */
   if (this->is_array()) {
      if (this->fields.array->is_scalar() ||
          this->fields.array->is_vector() ||
          this->fields.array->is_matrix()) {
         return MAX2(this->fields.array->std140_base_alignment(row_major), 16);
      } else {
         assert(this->fields.array->is_struct() ||
                this->fields.array->is_array());
         return this->fields.array->std140_base_alignment(row_major);
      }
   }

   /* (5) If the member is a column-major matrix with <C> columns and
    *     <R> rows, the matrix is stored identically to an array of
    *     <C> column vectors with <R> components each, according to
    *     rule (4).
    *
    * (7) If the member is a row-major matrix with <C> columns and <R>
    *     rows, the matrix is stored identically to an array of <R>
    *     row vectors with <C> components each, according to rule (4).
    */
   if (this->is_matrix()) {
      const struct glsl_type *vec_type, *array_type;
      int c = this->matrix_columns;
      int r = this->vector_elements;

      if (row_major) {
         vec_type = get_instance(base_type, c, 1);
         array_type = glsl_type::get_array_instance(vec_type, r);
      } else {
         vec_type = get_instance(base_type, r, 1);
         array_type = glsl_type::get_array_instance(vec_type, c);
      }

      return array_type->std140_base_alignment(false);
   }

   /* (9) If the member is a structure, the base alignment of the
    *     structure is <N>, where <N> is the largest base alignment
    *     value of any of its members, and rounded up to the base
    *     alignment of a vec4. The individual members of this
    *     sub-structure are then assigned offsets by applying this set
    *     of rules recursively, where the base offset of the first
    *     member of the sub-structure is equal to the aligned offset
    *     of the structure. The structure may have padding at the end;
    *     the base offset of the member following the sub-structure is
    *     rounded up to the next multiple of the base alignment of the
    *     structure.
    */
   if (this->is_struct()) {
      unsigned base_alignment = 16;
      for (unsigned i = 0; i < this->length; i++) {
         bool field_row_major = row_major;
         const enum glsl_matrix_layout matrix_layout =
            glsl_matrix_layout(this->fields.structure[i].matrix_layout);
         if (matrix_layout == GLSL_MATRIX_LAYOUT_ROW_MAJOR) {
            field_row_major = true;
         } else if (matrix_layout == GLSL_MATRIX_LAYOUT_COLUMN_MAJOR) {
            field_row_major = false;
         }

         const struct glsl_type *field_type = this->fields.structure[i].type;
         base_alignment = MAX2(base_alignment,
                               field_type->std140_base_alignment(field_row_major));
      }
      return base_alignment;
   }

   assert(!"not reached");
   return -1;
}